

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O0

void V_DrawFrame(int left,int top,int width,int height)

{
  DFrameBuffer *pDVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  FTexture *pFVar7;
  int bottom;
  int right;
  int offset;
  gameborder_t *border;
  FTexture *p;
  int height_local;
  int width_local;
  int top_local;
  int left_local;
  
  uVar2 = (uint)gameinfo.Border.offset;
  uVar3 = left + width;
  uVar4 = top + height;
  pcVar6 = FString::operator_cast_to_char_(&gameinfo.Border.t);
  pFVar7 = FTextureManager::operator[](&TexMan,pcVar6);
  pDVar1 = screen;
  iVar5 = FTexture::GetHeight(pFVar7);
  (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
            (pDVar1,(ulong)(uint)left,(ulong)(uint)(top - iVar5),(ulong)uVar3,(ulong)(uint)top,
             pFVar7,1);
  pcVar6 = FString::operator_cast_to_char_(&gameinfo.Border.b);
  pFVar7 = FTextureManager::operator[](&TexMan,pcVar6);
  pDVar1 = screen;
  iVar5 = FTexture::GetHeight(pFVar7);
  (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
            (pDVar1,(ulong)(uint)left,(ulong)uVar4,(ulong)uVar3,(ulong)(uVar4 + iVar5),pFVar7,1);
  pcVar6 = FString::operator_cast_to_char_(&gameinfo.Border.l);
  pFVar7 = FTextureManager::operator[](&TexMan,pcVar6);
  pDVar1 = screen;
  iVar5 = FTexture::GetWidth(pFVar7);
  (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
            (pDVar1,(ulong)(uint)(left - iVar5),(ulong)(uint)top,(ulong)(uint)left,(ulong)uVar4,
             pFVar7,1);
  pcVar6 = FString::operator_cast_to_char_(&gameinfo.Border.r);
  pFVar7 = FTextureManager::operator[](&TexMan,pcVar6);
  pDVar1 = screen;
  iVar5 = FTexture::GetWidth(pFVar7);
  (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
            (pDVar1,(ulong)uVar3,(ulong)(uint)top,(ulong)(uVar3 + iVar5),(ulong)uVar4,pFVar7,1);
  pDVar1 = screen;
  pcVar6 = FString::operator_cast_to_char_(&gameinfo.Border.tl);
  pFVar7 = FTextureManager::operator[](&TexMan,pcVar6);
  DCanvas::DrawTexture
            ((DCanvas *)pDVar1,pFVar7,(double)(int)(left - uVar2),(double)(int)(top - uVar2),0);
  pDVar1 = screen;
  pcVar6 = FString::operator_cast_to_char_(&gameinfo.Border.tr);
  pFVar7 = FTextureManager::operator[](&TexMan,pcVar6);
  DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar7,(double)(left + width),(double)(int)(top - uVar2),0)
  ;
  pDVar1 = screen;
  pcVar6 = FString::operator_cast_to_char_(&gameinfo.Border.bl);
  pFVar7 = FTextureManager::operator[](&TexMan,pcVar6);
  DCanvas::DrawTexture
            ((DCanvas *)pDVar1,pFVar7,(double)(int)(left - uVar2),(double)(top + height),0);
  pDVar1 = screen;
  pcVar6 = FString::operator_cast_to_char_(&gameinfo.Border.br);
  pFVar7 = FTextureManager::operator[](&TexMan,pcVar6);
  DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar7,(double)(left + width),(double)(top + height),0);
  return;
}

Assistant:

void V_DrawFrame (int left, int top, int width, int height)
{
	FTexture *p;
	const gameborder_t *border = &gameinfo.Border;
	// Sanity check for incomplete gameinfo
	if (border == NULL)
		return;
	int offset = border->offset;
	int right = left + width;
	int bottom = top + height;

	// Draw top and bottom sides.
	p = TexMan[border->t];
	screen->FlatFill(left, top - p->GetHeight(), right, top, p, true);
	p = TexMan[border->b];
	screen->FlatFill(left, bottom, right, bottom + p->GetHeight(), p, true);

	// Draw left and right sides.
	p = TexMan[border->l];
	screen->FlatFill(left - p->GetWidth(), top, left, bottom, p, true);
	p = TexMan[border->r];
	screen->FlatFill(right, top, right + p->GetWidth(), bottom, p, true);

	// Draw beveled corners.
	screen->DrawTexture (TexMan[border->tl], left-offset, top-offset, TAG_DONE);
	screen->DrawTexture (TexMan[border->tr], left+width, top-offset, TAG_DONE);
	screen->DrawTexture (TexMan[border->bl], left-offset, top+height, TAG_DONE);
	screen->DrawTexture (TexMan[border->br], left+width, top+height, TAG_DONE);
}